

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  _Alloc_hider _Var3;
  ostream *poVar4;
  size_t sVar5;
  pointer pSVar6;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  SourceLineInfo local_48;
  
  if ((this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo.
                           super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    pSVar6 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 3) *
                   0x4ec4ec4ec4ec4ec5)) {
      local_48.file._M_dataplus._M_p = local_48.file._M_dataplus._M_p & 0xffffffffffffff00;
      Colour::use(Headers);
      pSVar6 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar6 = pSVar6 + 1, pSVar6 != pSVar2) {
        printHeaderString(this,&pSVar6->name,2);
      }
      Colour::use(None);
      pSVar6 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    paVar1 = &local_48.file.field_2;
    _Var3._M_p = (pSVar6->lineInfo).file._M_dataplus._M_p;
    local_48.file._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,_Var3._M_p,_Var3._M_p + (pSVar6->lineInfo).file._M_string_length)
    ;
    local_48.line = (pSVar6->lineInfo).line;
    if (local_48.file._M_string_length != 0) {
      poVar4 = (this->super_StreamingReporterBase).stream;
      if (getLineOfChars<(char)45>()::line == '\0') {
        uRam00000000001796c0 = 0x2d2d2d2d2d2d2d;
        uRam00000000001796c7 = 0x2d2d2d2d2d2d2d2d;
        _DAT_001796b0 = 0x2d2d2d2d2d2d2d2d;
        uRam00000000001796b8 = 0x2d2d2d2d2d2d2d;
        DAT_001796bf = 0x2d;
        _DAT_001796a0 = 0x2d2d2d2d2d2d2d2d;
        uRam00000000001796a8 = 0x2d2d2d2d2d2d2d2d;
        _DAT_00179690 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000179698 = 0x2d2d2d2d2d2d2d2d;
        _line = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000179688 = 0x2d2d2d2d2d2d2d2d;
        DAT_001796cf = 0;
      }
      sVar5 = strlen(&getLineOfChars<(char)45>()::line);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,&getLineOfChars<(char)45>()::line,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      Colour::use(FileName);
      poVar4 = (this->super_StreamingReporterBase).stream;
      operator<<(poVar4,&local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      Colour::use(None);
    }
    poVar4 = (this->super_StreamingReporterBase).stream;
    if (getLineOfChars<(char)46>()::line == '\0') {
      uRam0000000000179710 = 0x2e2e2e2e2e2e2e;
      uRam0000000000179717 = 0x2e2e2e2e2e2e2e2e;
      _DAT_00179700 = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000179708 = 0x2e2e2e2e2e2e2e;
      DAT_0017970f = 0x2e;
      _DAT_001796f0 = 0x2e2e2e2e2e2e2e2e;
      uRam00000000001796f8 = 0x2e2e2e2e2e2e2e2e;
      _DAT_001796e0 = 0x2e2e2e2e2e2e2e2e;
      uRam00000000001796e8 = 0x2e2e2e2e2e2e2e2e;
      _line = 0x2e2e2e2e2e2e2e2e;
      uRam00000000001796d8 = 0x2e2e2e2e2e2e2e2e;
      DAT_0017971f = 0;
    }
    sVar5 = strlen(&getLineOfChars<(char)46>()::line);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,&getLineOfChars<(char)46>()::line,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.file._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.file._M_dataplus._M_p);
    }
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spirit-code[P]ovf/test/catch.hpp"
                ,0x265b,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }